

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

ListReader * __thiscall
capnp::_::OrphanBuilder::asListReaderAnySize(ListReader *__return_storage_ptr__,OrphanBuilder *this)

{
  SegmentBuilder **ppSVar1;
  ushort uVar2;
  StructPointerCount SVar3;
  StructDataBitCount SVar4;
  CapTableReader *pCVar5;
  ReadLimiter *pRVar6;
  word *pwVar7;
  Arena *pAVar8;
  size_t sVar9;
  int iVar10;
  undefined4 extraout_var;
  long lVar12;
  SegmentBuilder *pSVar13;
  ElementSize EVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  OrphanBuilder *pOVar18;
  ulong uVar19;
  ulong uVar20;
  SegmentBuilder **ppSVar21;
  Fault f;
  Fault local_38;
  SegmentBuilder *pSVar11;
  undefined4 extraout_var_00;
  
  uVar15 = (uint)(this->tag).content;
  if (*(int *)((long)&(this->tag).content + 4) == 0 && uVar15 == 0) goto LAB_00153b4f;
  pSVar11 = this->segment;
  pCVar5 = &this->capTable->super_CapTableReader;
  if ((uVar15 & 3) != 2 || pSVar11 == (SegmentBuilder *)0x0) {
    ppSVar21 = (SegmentBuilder **)this->location;
    goto LAB_00153952;
  }
  iVar10 = (*((pSVar11->super_SegmentReader).arena)->_vptr_Arena[2])();
  pSVar11 = (SegmentBuilder *)CONCAT44(extraout_var,iVar10);
  if (pSVar11 == (SegmentBuilder *)0x0) {
    asListReaderAnySize();
LAB_00153bb4:
    ppSVar21 = (SegmentBuilder **)0x0;
  }
  else {
    uVar15 = (uint)(this->tag).content;
    uVar16 = (ulong)(uVar15 >> 3);
    uVar20 = (pSVar11->super_SegmentReader).ptr.size_;
    if ((long)uVar20 < (long)uVar16) {
      uVar16 = uVar20;
    }
    uVar19 = 2 - (ulong)((uVar15 & 4) == 0);
    if (uVar20 < uVar16 + uVar19) {
LAB_00153baf:
      asListReaderAnySize();
      goto LAB_00153bb4;
    }
    pOVar18 = (OrphanBuilder *)((pSVar11->super_SegmentReader).ptr.ptr + uVar16);
    pRVar6 = (pSVar11->super_SegmentReader).readLimiter;
    uVar20 = pRVar6->limit;
    if (uVar20 < uVar19) {
      (*((pSVar11->super_SegmentReader).arena)->_vptr_Arena[3])();
      goto LAB_00153baf;
    }
    pRVar6->limit = uVar20 - uVar19;
    ppSVar1 = &pOVar18->segment;
    if (((this->tag).content & 4) == 0) {
      lVar12 = (long)((int)(pOVar18->tag).content >> 2);
      pwVar7 = (pSVar11->super_SegmentReader).ptr.ptr;
      ppSVar21 = (SegmentBuilder **)(pwVar7 + (pSVar11->super_SegmentReader).ptr.size_);
      this = pOVar18;
      if (((long)pwVar7 - (long)ppSVar1 >> 3 <= lVar12) &&
         (lVar12 <= (long)ppSVar21 - (long)ppSVar1 >> 3)) {
        ppSVar21 = ppSVar1 + lVar12;
      }
    }
    else {
      pAVar8 = (pSVar11->super_SegmentReader).arena;
      iVar10 = (*pAVar8->_vptr_Arena[2])(pAVar8,(ulong)*(uint *)((long)&(pOVar18->tag).content + 4))
      ;
      pSVar13 = (SegmentBuilder *)CONCAT44(extraout_var_00,iVar10);
      this = (OrphanBuilder *)ppSVar1;
      if (pSVar13 == (SegmentBuilder *)0x0) {
        asListReaderAnySize();
      }
      else {
        uVar15 = (uint)(pOVar18->tag).content;
        if ((uVar15 & 3) == 2) {
          uVar20 = (ulong)(uVar15 >> 3);
          sVar9 = (pSVar13->super_SegmentReader).ptr.size_;
          if ((long)sVar9 < (long)uVar20) {
            uVar20 = sVar9;
          }
          ppSVar21 = (SegmentBuilder **)((pSVar13->super_SegmentReader).ptr.ptr + uVar20);
          pSVar11 = pSVar13;
          goto LAB_00153952;
        }
        asListReaderAnySize();
      }
      ppSVar21 = (SegmentBuilder **)0x0;
    }
  }
LAB_00153952:
  if (ppSVar21 == (SegmentBuilder **)0x0) goto LAB_00153b4f;
  if (((this->tag).content & 3) != 1) {
    asListReaderAnySize();
    goto LAB_00153b4f;
  }
  uVar15 = *(uint *)((long)&(this->tag).content + 4);
  EVar14 = (ElementSize)uVar15 & INLINE_COMPOSITE;
  if (EVar14 != INLINE_COMPOSITE) {
    SVar4 = *(StructDataBitCount *)(BITS_PER_ELEMENT_TABLE + (ulong)EVar14 * 4);
    uVar20 = (ulong)(uVar15 >> 3);
    uVar17 = (uint)(EVar14 == POINTER) * 0x40 + SVar4;
    if (pSVar11 != (SegmentBuilder *)0x0) {
      uVar16 = uVar17 * uVar20 + 0x3f >> 6 & 0xffffffff;
      if (((long)ppSVar21 - (long)(pSVar11->super_SegmentReader).ptr.ptr >> 3) + uVar16 <=
          (pSVar11->super_SegmentReader).ptr.size_) {
        pRVar6 = (pSVar11->super_SegmentReader).readLimiter;
        uVar19 = pRVar6->limit;
        if (uVar16 <= uVar19) {
          pRVar6->limit = uVar19 - uVar16;
          goto LAB_00153adc;
        }
        (*((pSVar11->super_SegmentReader).arena)->_vptr_Arena[3])();
      }
      asListReaderAnySize();
      goto LAB_00153b4f;
    }
LAB_00153adc:
    if (EVar14 != BIT) {
      if ((uVar15 & 7) == 0) {
        if (pSVar11 != (SegmentBuilder *)0x0) {
          pRVar6 = (pSVar11->super_SegmentReader).readLimiter;
          uVar16 = pRVar6->limit;
          if (uVar16 < uVar20) {
            (*((pSVar11->super_SegmentReader).arena)->_vptr_Arena[3])();
            asListReaderAnySize();
            goto LAB_00153b4f;
          }
          pRVar6->limit = uVar16 - uVar20;
        }
        if (EVar14 == BIT) goto LAB_00153b17;
      }
      __return_storage_ptr__->segment = &pSVar11->super_SegmentReader;
      __return_storage_ptr__->capTable = pCVar5;
      __return_storage_ptr__->ptr = (byte *)ppSVar21;
      __return_storage_ptr__->elementCount = uVar15 >> 3;
      __return_storage_ptr__->step = uVar17;
      __return_storage_ptr__->structDataSize = SVar4;
      __return_storage_ptr__->structPointerCount = (ushort)(EVar14 == POINTER);
      __return_storage_ptr__->elementSize = EVar14;
      goto LAB_00153b96;
    }
LAB_00153b17:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x945,FAILED,(char *)0x0,
               "\"Found bit list where struct list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
               ,(char (*) [106])
                "Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
              );
    kj::_::Debug::Fault::~Fault(&local_38);
    goto LAB_00153b4f;
  }
  uVar20 = (ulong)(uVar15 >> 3);
  if (pSVar11 == (SegmentBuilder *)0x0) {
LAB_001539c9:
    if ((*(uint *)ppSVar21 & 3) == 0) {
      uVar17 = *(uint *)ppSVar21 >> 2 & 0x1fffffff;
      uVar16 = (ulong)uVar17;
      uVar15 = (uint)*(ushort *)((long)ppSVar21 + 6) + (uint)*(ushort *)((long)ppSVar21 + 4);
      if (uVar15 * uVar16 < uVar20 || uVar15 * uVar16 - uVar20 == 0) {
        if ((pSVar11 != (SegmentBuilder *)0x0) && (uVar15 == 0)) {
          pRVar6 = (pSVar11->super_SegmentReader).readLimiter;
          uVar20 = pRVar6->limit;
          if (uVar20 < uVar16) {
            (*((pSVar11->super_SegmentReader).arena)->_vptr_Arena[3])();
            asListReaderAnySize();
            goto LAB_00153b4f;
          }
          pRVar6->limit = uVar20 - uVar16;
        }
        uVar2 = *(ushort *)((long)ppSVar21 + 4);
        SVar3 = *(StructPointerCount *)((long)ppSVar21 + 6);
        __return_storage_ptr__->segment = &pSVar11->super_SegmentReader;
        __return_storage_ptr__->capTable = pCVar5;
        __return_storage_ptr__->ptr = (byte *)(ppSVar21 + 1);
        __return_storage_ptr__->elementCount = uVar17;
        __return_storage_ptr__->step = uVar15 * 0x40;
        __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
        __return_storage_ptr__->structPointerCount = SVar3;
        __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
LAB_00153b96:
        __return_storage_ptr__->nestingLimit = 0x7ffffffe;
        return __return_storage_ptr__;
      }
      asListReaderAnySize();
    }
    else {
      asListReaderAnySize();
    }
  }
  else {
    if (((long)ppSVar21 - (long)(pSVar11->super_SegmentReader).ptr.ptr >> 3) + uVar20 + 1 <=
        (pSVar11->super_SegmentReader).ptr.size_) {
      pRVar6 = (pSVar11->super_SegmentReader).readLimiter;
      uVar16 = pRVar6->limit;
      if (uVar20 + 1 <= uVar16) {
        pRVar6->limit = uVar16 - (uVar20 + 1);
        goto LAB_001539c9;
      }
      (*((pSVar11->super_SegmentReader).arena)->_vptr_Arena[3])();
    }
    asListReaderAnySize();
  }
LAB_00153b4f:
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  __return_storage_ptr__->segment = (SegmentReader *)0x0;
  __return_storage_ptr__->capTable = (CapTableReader *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 3) = 0;
  __return_storage_ptr__->nestingLimit = 0x7fffffff;
  return __return_storage_ptr__;
}

Assistant:

ListReader OrphanBuilder::asListReaderAnySize() const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readListPointer(
      segment, capTable, tagAsPtr(), location, nullptr, ElementSize::VOID /* dummy */,
      kj::maxValue);
}